

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie_test.cpp
# Opt level: O3

void __thiscall
DictTrieTest_UserDictWithMaxWeight_Test::~DictTrieTest_UserDictWithMaxWeight_Test
          (DictTrieTest_UserDictWithMaxWeight_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DictTrieTest, UserDictWithMaxWeight) {
  DictTrie trie(DICT_FILE, "../test/testdata/userdict.utf8", DictTrie::WordWeightMax);
  string word = "云计算";
  cppjieba::RuneStrArray unicode;
  ASSERT_TRUE(DecodeRunesInString(word, unicode));
  const DictUnit * unit = trie.Find(unicode.begin(), unicode.end());
  ASSERT_TRUE(unit);
  ASSERT_NEAR(unit->weight, -2.975, 0.001);
}